

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O0

string * vkt::sparse::getShaderImageCoordinates
                   (string *__return_storage_ptr__,ImageType imageType,string *x,string *xy,
                   string *xyz)

{
  allocator<char> local_31;
  string *local_30;
  string *xyz_local;
  string *xy_local;
  string *x_local;
  string *psStack_10;
  ImageType imageType_local;
  
  local_30 = xyz;
  xyz_local = xy;
  xy_local = x;
  x_local._4_4_ = imageType;
  psStack_10 = __return_storage_ptr__;
  if (imageType != IMAGE_TYPE_1D) {
    if (imageType - IMAGE_TYPE_1D_ARRAY < 2) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)xy);
      return __return_storage_ptr__;
    }
    if (imageType - IMAGE_TYPE_2D_ARRAY < 4) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)xyz);
      return __return_storage_ptr__;
    }
    if (imageType != IMAGE_TYPE_BUFFER) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_31);
      std::allocator<char>::~allocator(&local_31);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)x);
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderImageCoordinates	(const ImageType	imageType,
										 const std::string&	x,
										 const std::string&	xy,
										 const std::string&	xyz)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
			return x;

		case IMAGE_TYPE_1D_ARRAY:
		case IMAGE_TYPE_2D:
			return xy;

		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_3D:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			return xyz;

		default:
			DE_ASSERT(0);
			return "";
	}
}